

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  Option *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar2;
  int ret;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int h;
  int w;
  Mat *_bias_data;
  Mat bias_data_flattened;
  int k;
  int j;
  int i;
  float *wg;
  float *wg2;
  int g;
  int maxk;
  int inch_g;
  int outch_g;
  Mat weight_data_transposed;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_h;
  int _kernel_w;
  int _num_input;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  int in_stack_000003b0;
  int in_stack_000003b8;
  int in_stack_000003c0;
  int in_stack_000003c8;
  int in_stack_000003d0;
  int in_stack_000003d8;
  Mat *in_stack_000003e0;
  Option *in_stack_000003e8;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined4 in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  undefined8 in_stack_fffffffffffffb38;
  int iVar3;
  Mat *in_stack_fffffffffffffb40;
  Mat *in_stack_fffffffffffffb48;
  Mat *in_stack_fffffffffffffb50;
  void **ppvVar4;
  DeconvolutionDepthWise *in_stack_fffffffffffffb58;
  value_type local_3a0;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  const_reference local_340;
  void *local_338;
  int *local_330;
  undefined8 local_328;
  undefined4 local_320;
  long *local_318;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  int local_300;
  long local_2f8;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  void *local_2e0;
  void *local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  void *local_2c0;
  int *local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  long *local_2a0;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  int local_288;
  long local_280;
  undefined4 local_278;
  void *local_268;
  int *local_260;
  undefined8 local_258;
  undefined4 local_250;
  long *local_248;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined4 local_234;
  int local_230;
  long local_228;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  reference local_210;
  const_reference local_208;
  const_reference local_200;
  Option *local_1f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1f0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1e8;
  int local_1d4;
  void **local_1d0;
  void **local_1c8;
  void **local_1c0;
  value_type *local_1b8;
  value_type *local_1b0;
  void **local_1a0;
  void **local_190;
  void **local_180;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  reference in_stack_fffffffffffffe98;
  reference in_stack_fffffffffffffea0;
  reference in_stack_fffffffffffffea8;
  
  local_1f8 = in_RCX;
  local_1f0 = in_RDX;
  local_1e8 = in_RSI;
  local_200 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_208 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1e8,1);
  local_210 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1f0,0);
  local_214 = local_200->c;
  local_218 = local_208->w;
  local_21c = local_208->h;
  local_220 = local_208->d * *(int *)(in_RDI + 0x114);
  local_1d0 = &local_268;
  local_268 = (void *)0x0;
  local_260 = (int *)0x0;
  local_258 = 0;
  local_250 = 0;
  local_248 = (long *)0x0;
  local_240 = 0;
  local_23c = 0;
  local_238 = 0;
  local_234 = 0;
  local_230 = 0;
  local_228 = 0;
  flatten(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,(Option *)in_stack_fffffffffffffb40);
  if (local_268 == (void *)0x0 || local_228 * local_230 == 0) {
    local_1d4 = -100;
    local_278 = 1;
    goto LAB_0162b2a2;
  }
  local_1c8 = &local_2c0;
  local_2c0 = (void *)0x0;
  local_2b8 = (int *)0x0;
  local_2b0 = 0;
  local_2a8 = 0;
  local_2a0 = (long *)0x0;
  local_298 = 0;
  local_294 = 0;
  local_290 = 0;
  local_28c = 0;
  local_288 = 0;
  local_280 = 0;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
              in_stack_fffffffffffffb2c,
              CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
              (Allocator *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  if (local_2c0 == (void *)0x0 || local_280 * local_288 == 0) {
    local_1d4 = -100;
    local_278 = 1;
  }
  else {
    local_2c4 = local_220 / *(int *)(in_RDI + 0x114);
    local_2c8 = local_214 / *(int *)(in_RDI + 0x114);
    local_2cc = local_21c * local_218;
    for (local_2d0 = 0; local_2d0 < *(int *)(in_RDI + 0x114); local_2d0 = local_2d0 + 1) {
      local_2d8 = (void *)((long)local_2c0 +
                          (long)(local_2d0 * local_2c4 * local_2c8 * local_2cc) * 4);
      local_2e0 = (void *)((long)local_268 +
                          (long)(local_2d0 * local_2c8 * local_2c4 * local_2cc) * 4);
      for (local_2e4 = 0; local_2e4 < local_2c4; local_2e4 = local_2e4 + 1) {
        for (local_2e8 = 0; local_2e8 < local_2c8; local_2e8 = local_2e8 + 1) {
          for (local_2ec = 0; local_2ec < local_2cc; local_2ec = local_2ec + 1) {
            *(undefined4 *)
             ((long)local_2d8 +
             (long)((local_2e4 * local_2c8 + local_2e8) * local_2cc + local_2ec) * 4) =
                 *(undefined4 *)
                  ((long)local_2e0 +
                  (long)((local_2e8 * local_2c4 + local_2e4) * local_2cc + local_2ec) * 4);
          }
        }
      }
    }
    local_1c0 = &local_338;
    local_338 = (void *)0x0;
    local_330 = (int *)0x0;
    local_328 = 0;
    local_320 = 0;
    local_318 = (long *)0x0;
    local_310 = 0;
    local_30c = 0;
    local_308 = 0;
    local_304 = 0;
    local_300 = 0;
    local_2f8 = 0;
    if (*(int *)(in_RDI + 0x10c) == 0) {
LAB_0162a57a:
      local_344 = local_200->w;
      local_348 = local_200->h;
      local_34c = *(int *)(in_RDI + 0xdc) * (local_218 + -1) + 1;
      local_350 = *(int *)(in_RDI + 0xe0) * (local_21c + -1) + 1;
      local_354 = (local_344 + -1) * *(int *)(in_RDI + 0xe4) + local_34c + *(int *)(in_RDI + 0xfc);
      local_358 = (local_348 + -1) * *(int *)(in_RDI + 0xe8) + local_350 + *(int *)(in_RDI + 0x100);
      local_1b8 = &local_3a0;
      local_3a0.data = (void *)0x0;
      local_3a0.refcount = (int *)0x0;
      local_3a0.elemsize = 0;
      local_3a0.elempack = 0;
      local_3a0.allocator = (Allocator *)0x0;
      local_3a0.dims = 0;
      local_3a0.w = 0;
      local_3a0.h = 0;
      local_3a0.d = 0;
      local_3a0.c = 0;
      local_3a0.cstep = 0;
      iVar3 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
      if ((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
          (*(int *)(in_RDI + 0xf4) < 1)) &&
         ((*(int *)(in_RDI + 0xf8) < 1 &&
          ((*(int *)(in_RDI + 0x104) < 1 || (*(int *)(in_RDI + 0x108) < 1)))))) {
        in_stack_fffffffffffffea0 = &local_3a0;
        if (in_stack_fffffffffffffea0 != local_210) {
          if (local_210->refcount != (int *)0x0) {
            piVar1 = local_210->refcount;
            in_stack_fffffffffffffe94 = 1;
            LOCK();
            in_stack_fffffffffffffe90 = *piVar1;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_3a0.data = local_210->data;
          local_3a0.refcount = local_210->refcount;
          local_3a0.elemsize = local_210->elemsize;
          local_3a0.elempack = local_210->elempack;
          local_3a0.allocator = local_210->allocator;
          local_3a0.dims = local_210->dims;
          local_3a0.w = local_210->w;
          local_3a0.h = local_210->h;
          local_3a0.d = local_210->d;
          local_3a0.c = local_210->c;
          local_3a0.cstep = local_210->cstep;
        }
        in_stack_fffffffffffffe98 = local_210;
        in_stack_fffffffffffffea8 = in_stack_fffffffffffffea0;
        Mat::create(in_stack_fffffffffffffb40,iVar3,(int)in_stack_fffffffffffffb38,
                    in_stack_fffffffffffffb34,
                    CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                    (Allocator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      }
      else {
        Mat::create(in_stack_fffffffffffffb40,iVar3,(int)in_stack_fffffffffffffb38,
                    in_stack_fffffffffffffb34,
                    CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                    (Allocator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      }
      if (local_3a0.data == (void *)0x0 || local_3a0.cstep * (long)local_3a0.c == 0) {
        local_1d4 = -100;
      }
      else {
        local_1d4 = deconvolutiondepthwise
                              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                               in_stack_fffffffffffffe98,
                               (Mat *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,in_stack_000003b0
                               ,in_stack_000003b8,in_stack_000003c0,in_stack_000003c8,
                               in_stack_000003d0,in_stack_000003d8,in_stack_000003e0,
                               in_stack_000003e8);
        if (local_1d4 == 0) {
          cut_padding(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                      local_1f8);
          bVar2 = true;
          if (local_210->data != (void *)0x0) {
            bVar2 = local_210->cstep * (long)local_210->c == 0;
          }
          if (bVar2) {
            local_1d4 = -100;
          }
          else {
            local_1d4 = 0;
          }
        }
      }
      local_278 = 1;
      local_1b0 = &local_3a0;
      if (local_3a0.refcount != (int *)0x0) {
        LOCK();
        iVar3 = *local_3a0.refcount;
        *local_3a0.refcount = *local_3a0.refcount + -1;
        UNLOCK();
        if (iVar3 == 1) {
          if (local_3a0.allocator == (Allocator *)0x0) {
            if (local_3a0.data != (void *)0x0) {
              free(local_3a0.data);
            }
          }
          else {
            (*(local_3a0.allocator)->_vptr_Allocator[3])(local_3a0.allocator,local_3a0.data);
          }
        }
      }
      local_3a0.data = (void *)0x0;
      local_3a0.elemsize = 0;
      local_3a0.elempack = 0;
      local_3a0.dims = 0;
      local_3a0.w = 0;
      local_3a0.h = 0;
      local_3a0.d = 0;
      local_3a0.c = 0;
      local_3a0.cstep = 0;
      local_3a0.refcount = (int *)0x0;
    }
    else {
      local_340 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1e8,2);
      flatten(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
              (Option *)in_stack_fffffffffffffb40);
      if (local_338 != (void *)0x0 && local_2f8 * local_300 != 0) goto LAB_0162a57a;
      local_1d4 = -100;
      local_278 = 1;
    }
    local_1a0 = &local_338;
    if (local_330 != (int *)0x0) {
      LOCK();
      iVar3 = *local_330;
      *local_330 = *local_330 + -1;
      UNLOCK();
      if (iVar3 == 1) {
        if (local_318 == (long *)0x0) {
          if (local_338 != (void *)0x0) {
            free(local_338);
          }
        }
        else {
          (**(code **)(*local_318 + 0x18))(local_318,local_338);
        }
      }
    }
    local_338 = (void *)0x0;
    local_328 = 0;
    local_320 = 0;
    local_310 = 0;
    local_30c = 0;
    local_308 = 0;
    local_304 = 0;
    local_300 = 0;
    local_2f8 = 0;
    local_330 = (int *)0x0;
  }
  local_190 = &local_2c0;
  if (local_2b8 != (int *)0x0) {
    LOCK();
    iVar3 = *local_2b8;
    *local_2b8 = *local_2b8 + -1;
    UNLOCK();
    if (iVar3 == 1) {
      if (local_2a0 == (long *)0x0) {
        if (local_2c0 != (void *)0x0) {
          free(local_2c0);
        }
      }
      else {
        (**(code **)(*local_2a0 + 0x18))(local_2a0,local_2c0);
      }
    }
  }
  local_2c0 = (void *)0x0;
  local_2b0 = 0;
  local_2a8 = 0;
  local_298 = 0;
  local_294 = 0;
  local_290 = 0;
  local_28c = 0;
  local_288 = 0;
  local_280 = 0;
  local_2b8 = (int *)0x0;
LAB_0162b2a2:
  ppvVar4 = &local_268;
  if (local_260 != (int *)0x0) {
    LOCK();
    iVar3 = *local_260;
    *local_260 = *local_260 + -1;
    UNLOCK();
    if (iVar3 == 1) {
      local_180 = ppvVar4;
      if (local_248 == (long *)0x0) {
        if (local_268 != (void *)0x0) {
          free(local_268);
        }
      }
      else {
        (**(code **)(*local_248 + 0x18))(local_248,local_268);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  return local_1d4;
}

Assistant:

int DeconvolutionDepthWise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}